

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O1

void __thiscall
GuillotineBinPack::Insert
          (GuillotineBinPack *this,TArray<RectSize,_RectSize> *rects,TArray<Rect,_Rect> *dst,
          bool merge,FreeRectChoiceHeuristic rectChoice,GuillotineSplitHeuristic splitMethod)

{
  uint *puVar1;
  int iVar2;
  int height;
  long lVar3;
  int iVar4;
  bool bVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  uint uVar7;
  Rect *pRVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  Rect newNode;
  ulong local_70;
  ulong local_68;
  Rect local_58;
  undefined4 local_48;
  GuillotineSplitHeuristic local_44;
  DisjointRectCollection *local_40;
  TArray<Rect,_Rect> *local_38;
  
  local_48 = (undefined4)CONCAT71(in_register_00000009,merge);
  if (dst->Count != 0) {
    dst->Count = 0;
  }
  if (*(int *)(rects + 0xc) != 0) {
    local_38 = &this->usedRectangles;
    local_40 = &this->disjointRects;
    local_68 = 0;
    local_70 = 0;
    bVar5 = false;
    local_44 = splitMethod;
    do {
      if ((this->freeRectangles).Count == 0) {
        bVar13 = true;
      }
      else {
        iVar12 = 0x7fffffff;
        uVar11 = 0;
        do {
          if (*(int *)(rects + 0xc) != 0) {
            uVar9 = 0;
            do {
              lVar3 = *(long *)rects;
              iVar4 = *(int *)(lVar3 + uVar9 * 8);
              pRVar8 = (this->freeRectangles).Array;
              iVar2 = pRVar8[uVar11].width;
              pRVar8 = pRVar8 + uVar11;
              if ((iVar4 == iVar2) && (*(int *)(lVar3 + 4 + uVar9 * 8) == pRVar8->height)) {
                uVar10 = (this->freeRectangles).Count;
                bVar5 = false;
LAB_002fea4f:
                iVar12 = -0x80000000;
                local_70 = uVar9;
                local_68 = uVar11;
                goto LAB_002fea5c;
              }
              height = *(int *)(lVar3 + 4 + uVar9 * 8);
              if ((height == iVar2) && (iVar4 == pRVar8->height)) {
                uVar10 = (this->freeRectangles).Count;
                bVar5 = true;
                goto LAB_002fea4f;
              }
              if ((iVar2 < iVar4) || (pRVar8->height < height)) {
                if ((height <= iVar2) &&
                   ((iVar4 <= pRVar8->height &&
                    (iVar4 = ScoreByHeuristic(height,iVar4,pRVar8,rectChoice), iVar4 < iVar12)))) {
                  bVar5 = true;
                  goto LAB_002fea02;
                }
              }
              else {
                iVar4 = ScoreByHeuristic(iVar4,height,pRVar8,rectChoice);
                if (iVar4 < iVar12) {
                  bVar5 = false;
LAB_002fea02:
                  local_70 = uVar9 & 0xffffffff;
                  iVar12 = iVar4;
                  local_68 = uVar11;
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < *(uint *)(rects + 0xc));
          }
          uVar10 = (uint)uVar11;
LAB_002fea5c:
          uVar11 = (ulong)(uVar10 + 1);
        } while (uVar10 + 1 < (this->freeRectangles).Count);
        bVar13 = iVar12 == 0x7fffffff;
      }
      if (bVar13) {
        return;
      }
      uVar7 = (uint)local_68;
      pRVar8 = (this->freeRectangles).Array;
      local_58.x = pRVar8[(int)uVar7].x;
      local_58.y = pRVar8[(int)uVar7].y;
      uVar10 = (uint)local_70;
      iVar12 = *(int *)(*(long *)rects + (long)(int)uVar10 * 8);
      local_58.height = *(int *)(*(long *)rects + 4 + (long)(int)uVar10 * 8);
      local_58.width = iVar12;
      if (bVar5) {
        local_58.width = local_58.height;
        local_58.height = iVar12;
      }
      SplitFreeRectByHeuristic(this,pRVar8 + (int)uVar7,&local_58,local_44);
      uVar6 = (this->freeRectangles).Count;
      if (uVar7 < uVar6) {
        uVar6 = uVar6 - 1;
        (this->freeRectangles).Count = uVar6;
        if (uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
          pRVar8 = (this->freeRectangles).Array;
          memmove(pRVar8 + local_68,pRVar8 + (uVar7 + 1),(ulong)(uVar6 - uVar7) << 4);
        }
      }
      if (uVar10 < *(uint *)(rects + 0xc)) {
        uVar7 = *(uint *)(rects + 0xc) - 1;
        *(uint *)(rects + 0xc) = uVar7;
        if (uVar10 <= uVar7 && uVar7 - uVar10 != 0) {
          memmove((void *)(*(long *)rects + (local_70 & 0xffffffff) * 8),
                  (void *)(*(long *)rects + (ulong)(uVar10 + 1) * 8),(ulong)(uVar7 - uVar10) << 3);
        }
      }
      if ((char)local_48 != '\0') {
        MergeFreeList(this);
      }
      TArray<Rect,_Rect>::Grow(local_38,1);
      pRVar8 = (this->usedRectangles).Array + (this->usedRectangles).Count;
      pRVar8->x = local_58.x;
      pRVar8->y = local_58.y;
      pRVar8->width = local_58.width;
      pRVar8->height = local_58.height;
      puVar1 = &(this->usedRectangles).Count;
      *puVar1 = *puVar1 + 1;
      bVar13 = DisjointRectCollection::Add(local_40,&local_58);
      if (!bVar13) {
        __assert_fail("disjointRects.Add(newNode) == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                      ,0x94,
                      "void GuillotineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &, bool, FreeRectChoiceHeuristic, GuillotineSplitHeuristic)"
                     );
      }
    } while (*(int *)(rects + 0xc) != 0);
  }
  return;
}

Assistant:

void GuillotineBinPack::Insert(TArray<RectSize> &rects, TArray<Rect> &dst, bool merge, 
	FreeRectChoiceHeuristic rectChoice, GuillotineSplitHeuristic splitMethod)
{
	dst.Clear();

	// Remember variables about the best packing choice we have made so far during the iteration process.
	int bestFreeRect = 0;
	int bestRect = 0;
	bool bestFlipped = false;

	// Pack rectangles one at a time until we have cleared the rects array of all rectangles.
	// rects will get destroyed in the process.
	while(rects.Size() > 0)
	{
		// Stores the penalty score of the best rectangle placement - bigger=worse, smaller=better.
		int bestScore = INT_MAX;

		for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		{
			for(unsigned j = 0; j < rects.Size(); ++j)
			{
				// If this rectangle is a perfect match, we pick it instantly.
				if (rects[j].width == freeRectangles[i].width && rects[j].height == freeRectangles[i].height)
				{
					bestFreeRect = i;
					bestRect = j;
					bestFlipped = false;
					bestScore = INT_MIN;
					i = freeRectangles.Size(); // Force a jump out of the outer loop as well - we got an instant fit.
					break;
				}
				// If flipping this rectangle is a perfect match, pick that then.
				else if (rects[j].height == freeRectangles[i].width && rects[j].width == freeRectangles[i].height)
				{
					bestFreeRect = i;
					bestRect = j;
					bestFlipped = true;
					bestScore = INT_MIN;
					i = freeRectangles.Size(); // Force a jump out of the outer loop as well - we got an instant fit.
					break;
				}
				// Try if we can fit the rectangle upright.
				else if (rects[j].width <= freeRectangles[i].width && rects[j].height <= freeRectangles[i].height)
				{
					int score = ScoreByHeuristic(rects[j].width, rects[j].height, freeRectangles[i], rectChoice);
					if (score < bestScore)
					{
						bestFreeRect = i;
						bestRect = j;
						bestFlipped = false;
						bestScore = score;
					}
				}
				// If not, then perhaps flipping sideways will make it fit?
				else if (rects[j].height <= freeRectangles[i].width && rects[j].width <= freeRectangles[i].height)
				{
					int score = ScoreByHeuristic(rects[j].height, rects[j].width, freeRectangles[i], rectChoice);
					if (score < bestScore)
					{
						bestFreeRect = i;
						bestRect = j;
						bestFlipped = true;
						bestScore = score;
					}
				}
			}
		}

		// If we didn't manage to find any rectangle to pack, abort.
		if (bestScore == INT_MAX)
			return;

		// Otherwise, we're good to go and do the actual packing.
		Rect newNode;
		newNode.x = freeRectangles[bestFreeRect].x;
		newNode.y = freeRectangles[bestFreeRect].y;
		newNode.width = rects[bestRect].width;
		newNode.height = rects[bestRect].height;

		if (bestFlipped)
			std::swap(newNode.width, newNode.height);

		// Remove the free space we lost in the bin.
		SplitFreeRectByHeuristic(freeRectangles[bestFreeRect], newNode, splitMethod);
		freeRectangles.Delete(bestFreeRect);

		// Remove the rectangle we just packed from the input list.
		rects.Delete(bestRect);

		// Perform a Rectangle Merge step if desired.
		if (merge)
			MergeFreeList();

		// Remember the new used rectangle.
		usedRectangles.Push(newNode);

		// Check that we're really producing correct packings here.
#ifdef _DEBUG
		assert(disjointRects.Add(newNode) == true);
#endif
	}
}